

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger get_slice_params(HSQUIRRELVM v,SQInteger *sidx,SQInteger *eidx,SQObjectPtr *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQInteger SVar5;
  SQObjectPtr *pSVar6;
  SQObjectValue SVar7;
  SQTable *pSVar8;
  
  SVar5 = sq_gettop(v);
  *sidx = 0;
  *eidx = 0;
  pSVar6 = SQVM::GetAt(v,v->_stackbase);
  SVar2 = (o->super_SQObject)._type;
  pSVar8 = (o->super_SQObject)._unVal.pTable;
  pSVar4 = (pSVar6->super_SQObject)._unVal.pTable;
  (o->super_SQObject)._unVal.pTable = pSVar4;
  SVar3 = (pSVar6->super_SQObject)._type;
  (o->super_SQObject)._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  if (1 < SVar5) {
    pSVar6 = SQVM::GetAt(v,v->_stackbase + 1);
    SVar2 = (pSVar6->super_SQObject)._type;
    if ((SVar2 >> 0x1a & 1) != 0) {
      if (SVar2 == OT_FLOAT) {
        SVar7.nInteger = (SQInteger)(pSVar6->super_SQObject)._unVal.fFloat;
      }
      else {
        SVar7 = (pSVar6->super_SQObject)._unVal;
      }
      *sidx = (SQInteger)SVar7;
    }
    if (SVar5 != 2) {
      pSVar6 = SQVM::GetAt(v,v->_stackbase + 2);
      SVar2 = (pSVar6->super_SQObject)._type;
      if ((SVar2 >> 0x1a & 1) == 0) {
        return (SQInteger)pSVar6;
      }
      if (SVar2 == OT_FLOAT) {
        pSVar8 = (SQTable *)(long)(pSVar6->super_SQObject)._unVal.fFloat;
      }
      else {
        pSVar8 = (pSVar6->super_SQObject)._unVal.pTable;
      }
      goto LAB_00129962;
    }
  }
  pSVar8 = (SQTable *)sq_getsize(v,1);
LAB_00129962:
  *eidx = (SQInteger)pSVar8;
  return (SQInteger)pSVar8;
}

Assistant:

static SQInteger get_slice_params(HSQUIRRELVM v,SQInteger &sidx,SQInteger &eidx,SQObjectPtr &o)
{
    SQInteger top = sq_gettop(v);
    sidx=0;
    eidx=0;
    o=stack_get(v,1);
    if(top>1){
        SQObjectPtr &start=stack_get(v,2);
        if(sq_type(start)!=OT_NULL && sq_isnumeric(start)){
            sidx=tointeger(start);
        }
    }
    if(top>2){
        SQObjectPtr &end=stack_get(v,3);
        if(sq_isnumeric(end)){
            eidx=tointeger(end);
        }
    }
    else {
        eidx = sq_getsize(v,1);
    }
    return 1;
}